

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O1

int __thiscall Server::Private::remove(Private *this,char *__filename)

{
  int iVar1;
  
  Socket::Poll::remove(&this->_sockets,__filename);
  iVar1 = PoolList<Server::Private::ListenerImpl>::remove(&this->_listeners,__filename);
  return iVar1;
}

Assistant:

void Server::Private::remove(ListenerImpl &listener)
{
  _sockets.remove(listener);
  _listeners.remove(listener);
}